

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# siamese.cpp
# Opt level: O0

SiameseResult siamese_decoder_stats(SiameseDecoder decoder_t,uint64_t *statsOut,uint statsCount)

{
  uint in_EDX;
  uint64_t *in_RSI;
  Decoder *in_RDI;
  Decoder *decoder;
  undefined4 local_4;
  
  if (((in_RDI == (Decoder *)0x0) || (in_RSI == (uint64_t *)0x0)) || (in_EDX == 0)) {
    local_4 = Siamese_InvalidInput;
  }
  else {
    local_4 = siamese::Decoder::GetStatistics(in_RDI,in_RSI,in_EDX);
  }
  return local_4;
}

Assistant:

SIAMESE_EXPORT SiameseResult siamese_decoder_stats(
    SiameseDecoder decoder_t,
    uint64_t* statsOut,
    unsigned statsCount)
{
    siamese::Decoder* decoder = reinterpret_cast<siamese::Decoder*>(decoder_t);
    if (!decoder || !statsOut || statsCount <= 0)
        return Siamese_InvalidInput;

    return decoder->GetStatistics(
        statsOut,
        statsCount);
}